

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gzputc(gzFile file,int c)

{
  int iVar1;
  ulong uVar2;
  z_size_t zVar3;
  uint uVar4;
  uchar buf [1];
  undefined1 local_19;
  
  uVar4 = 0xffffffff;
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) && (*(int *)((long)&file[4].pos + 4) == 0)
     ) {
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar1 = gz_zero((gz_statep)file,(off64_t)file[4].next);
      if (iVar1 == -1) {
        return -1;
      }
    }
    uVar4 = (uint)file[1].pos;
    if (uVar4 != 0) {
      uVar2 = (ulong)(uint)file[5].pos;
      if (uVar2 == 0) {
        file[5].next = *(uchar **)(file + 2);
      }
      if ((uint)(file[5].next + (uVar2 - *(long *)(file + 2))) < uVar4) {
        *(char *)(*(long *)(file + 2) +
                 ((ulong)(file[5].next + (uVar2 - *(long *)(file + 2))) & 0xffffffff)) = (char)c;
        *(int *)&file[5].pos = (int)file[5].pos + 1;
        file->pos = file->pos + 1;
        return c & 0xff;
      }
    }
    local_19 = (char)c;
    zVar3 = gz_write((gz_statep)file,&local_19,1);
    uVar4 = 0xffffffff;
    if (zVar3 == 1) {
      uVar4 = c & 0xff;
    }
  }
  return uVar4;
}

Assistant:

int ZEXPORT gzputc(gzFile file, int c) {
    unsigned have;
    unsigned char buf[1];
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return -1;
    }

    /* try writing to input buffer for speed (state->size == 0 if buffer not
       initialized) */
    if (state->size) {
        if (strm->avail_in == 0)
            strm->next_in = state->in;
        have = (unsigned)((strm->next_in + strm->avail_in) - state->in);
        if (have < state->size) {
            state->in[have] = (unsigned char)c;
            strm->avail_in++;
            state->x.pos++;
            return c & 0xff;
        }
    }

    /* no room in buffer or not initialized, use gz_write() */
    buf[0] = (unsigned char)c;
    if (gz_write(state, buf, 1) != 1)
        return -1;
    return c & 0xff;
}